

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd,int mi_row,int mi_col)

{
  uint uVar1;
  ulong uVar2;
  InterpFilterParams *pIVar3;
  MV mv;
  int_mv local_114;
  uint8_t *local_110;
  InterPredParams local_108;
  
  local_108.pix_col = mi_col << 2;
  local_108.pix_row = mi_row << 2;
  local_110 = xd->plane[0].dst.buf;
  local_114 = (*xd->mi)->mv[0];
  local_108.subsampling_x = xd->plane[0].subsampling_x;
  local_108.subsampling_y = xd->plane[0].subsampling_y;
  local_108.use_hbd_buf = (uint)xd->cur_buf->flags >> 3 & 1;
  uVar1 = ((*xd->mi)->interp_filters).as_int;
  local_108.top = (0x120U >> ((byte)local_108.subsampling_y & 0x1f)) * -0x400 + 0x1000;
  local_108.left = (0x120U >> ((byte)local_108.subsampling_x & 0x1f)) * -0x400 + 0x1000;
  uVar2 = (ulong)(uVar1 >> 0xc & 0xff0);
  pIVar3 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar2);
  local_108.interp_filter_params[0] =
       (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar2);
  if ((char)(uVar1 >> 0x10) == '\x04') {
    local_108.interp_filter_params[0] = pIVar3;
  }
  local_108.block_width = (int)xd->plane[0].width;
  if (4 < (uint)local_108.block_width) {
    local_108.interp_filter_params[0] = pIVar3;
  }
  uVar2 = (ulong)((uVar1 & 0xff) << 4);
  pIVar3 = (InterpFilterParams *)((long)&av1_interp_filter_params_list[0].filter_ptr + uVar2);
  local_108.scale_factors = xd->block_ref_scale_factors[0];
  local_108.bit_depth = xd->bd;
  local_108.interp_filter_params[1] =
       (InterpFilterParams *)((long)&av1_interp_4tap[0].filter_ptr + uVar2);
  if ((char)uVar1 == '\x04') {
    local_108.interp_filter_params[1] = pIVar3;
  }
  local_108.block_height = (int)xd->plane[0].height;
  local_108.is_intrabc = 0;
  local_108.mode = TRANSLATION_PRED;
  local_108.comp_mode = UNIFORM_SINGLE;
  if (4 < (uint)local_108.block_height) {
    local_108.interp_filter_params[1] = pIVar3;
  }
  local_108.ref_frame_buf.buf = xd->plane[0].pre[0].buf;
  local_108.ref_frame_buf.buf0 = xd->plane[0].pre[0].buf0;
  local_108.ref_frame_buf.width = xd->plane[0].pre[0].width;
  local_108.ref_frame_buf.height = xd->plane[0].pre[0].height;
  local_108.ref_frame_buf.stride = xd->plane[0].pre[0].stride;
  local_108.ref_frame_buf._28_4_ = *(undefined4 *)&xd->plane[0].pre[0].field_0x1c;
  local_108.conv_params.round_0 = 3;
  if (10 < local_108.bit_depth) {
    local_108.conv_params.round_0 = local_108.bit_depth + -7;
  }
  local_108.conv_params.round_1 = 0xb;
  if (10 < local_108.bit_depth) {
    local_108.conv_params.round_1 = 0x15 - local_108.bit_depth;
  }
  local_108.conv_params.dst = xd->tmp_conv_dst;
  local_108.conv_params.do_average = 0;
  local_108.conv_params.dst_stride = 0x80;
  local_108.conv_params.plane = 0;
  local_108.conv_params.is_compound = 0;
  local_108.conv_params.use_dist_wtd_comp_avg = 0;
  build_one_inter_predictor(local_110,xd->plane[0].dst.stride,&local_114.as_mv,&local_108);
  return;
}

Assistant:

void av1_enc_build_inter_predictor_y(MACROBLOCKD *xd, int mi_row, int mi_col) {
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  InterPredParams inter_pred_params;

  struct buf_2d *const dst_buf = &pd->dst;
  uint8_t *const dst = dst_buf->buf;
  const MV mv = xd->mi[0]->mv[0].as_mv;
  const struct scale_factors *const sf = xd->block_ref_scale_factors[0];

  av1_init_inter_params(&inter_pred_params, pd->width, pd->height, mi_y, mi_x,
                        pd->subsampling_x, pd->subsampling_y, xd->bd,
                        is_cur_buf_hbd(xd), false, sf, pd->pre,
                        xd->mi[0]->interp_filters);

  inter_pred_params.conv_params = get_conv_params_no_round(
      0, AOM_PLANE_Y, xd->tmp_conv_dst, MAX_SB_SIZE, false, xd->bd);

  inter_pred_params.conv_params.use_dist_wtd_comp_avg = 0;
  av1_enc_build_one_inter_predictor(dst, dst_buf->stride, &mv,
                                    &inter_pred_params);
}